

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue JS_ReadArray(BCReaderState *s,int tag)

{
  JSContext *ctx;
  JSShape *sh;
  int iVar1;
  JSValueUnion p;
  double dVar2;
  double dVar3;
  JSValue this_obj;
  JSValue JVar4;
  JSValue prop;
  uint32_t len;
  uint local_44;
  JSValueUnion local_40;
  int64_t iStack_38;
  
  ctx = s->ctx;
  sh = ctx->array_shape;
  (sh->header).ref_count = (sh->header).ref_count + 1;
  this_obj = JS_NewObjectFromShape(ctx,sh,2);
  p = this_obj.u;
  iVar1 = BC_add_object_ref1(s,(JSObject *)p.ptr);
  if (iVar1 == 0) {
    iVar1 = bc_get_leb128(s,&local_44);
    if (iVar1 == 0) {
      if ((double)(ulong)local_44 != 0.0) {
        dVar3 = 0.0;
        do {
          JVar4 = JS_ReadObjectRec(s);
          if ((int)JVar4.tag == 6) goto LAB_0013f164;
          dVar2 = (double)((ulong)dVar3 & 0xffffffff);
          if (-1 < SUB84(dVar3,0)) {
            dVar2 = dVar3;
          }
          prop.tag._0_4_ = (uint)((ulong)(long)SUB84(dVar3,0) >> 0x1f) & 7;
          prop.u.float64 = dVar2;
          prop.tag._4_4_ = 0;
          _local_40 = JVar4;
          iVar1 = JS_DefinePropertyValueValue(ctx,this_obj,prop,JVar4,(uint)(tag != 0xd) * 3 + 4);
          if (iVar1 < 0) goto LAB_0013f164;
          dVar3 = (double)((long)dVar3 + 1);
        } while ((double)(ulong)local_44 != dVar3);
      }
      if (tag != 0xd) {
        return this_obj;
      }
      JVar4 = JS_ReadObjectRec(s);
      if ((int)JVar4.tag != 6) {
        if ((int)JVar4.tag != 3) {
          iVar1 = JS_DefinePropertyValue(ctx,this_obj,0x70,JVar4,0);
          if (iVar1 < 0) goto LAB_0013f164;
        }
        JS_PreventExtensions(ctx,this_obj);
        return this_obj;
      }
    }
  }
LAB_0013f164:
  local_40.float64 = p.float64;
  if ((0xfffffff4 < (uint)this_obj.tag) && (iVar1 = *p.ptr, *(int *)p.ptr = iVar1 + -1, iVar1 < 2))
  {
    __JS_FreeValueRT(ctx->rt,this_obj);
  }
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue JS_ReadArray(BCReaderState *s, int tag)
{
    JSContext *ctx = s->ctx;
    JSValue obj;
    uint32_t len, i;
    JSValue val;
    int ret, prop_flags;
    BOOL is_template;

    obj = JS_NewArray(ctx);
    if (BC_add_object_ref(s, obj))
        goto fail;
    is_template = (tag == BC_TAG_TEMPLATE_OBJECT);
    if (bc_get_leb128(s, &len))
        goto fail;
    for(i = 0; i < len; i++) {
        val = JS_ReadObjectRec(s);
        if (JS_IsException(val))
            goto fail;
        if (is_template)
            prop_flags = JS_PROP_ENUMERABLE;
        else
            prop_flags = JS_PROP_C_W_E;
        ret = JS_DefinePropertyValueUint32(ctx, obj, i, val,
                                           prop_flags);
        if (ret < 0)
            goto fail;
    }
    if (is_template) {
        val = JS_ReadObjectRec(s);
        if (JS_IsException(val))
            goto fail;
        if (!JS_IsUndefined(val)) {
            ret = JS_DefinePropertyValue(ctx, obj, JS_ATOM_raw, val, 0);
            if (ret < 0)
                goto fail;
        }
        JS_PreventExtensions(ctx, obj);
    }
    return obj;
 fail:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}